

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O2

bool __thiscall chrono::ChSolverGMRES::SetupProblem(ChSolverGMRES *this)

{
  GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner> *this_00;
  ComputationInfo CVar1;
  
  this_00 = this->m_engine;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_preconditioner.m_N =
       (this->super_ChIterativeSolverLS).m_rhs.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_preconditioner.m_invdiag = &(this->super_ChIterativeSolverLS).m_invdiag;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_preconditioner.m_diag_precond =
       0 < (this->super_ChIterativeSolverLS).m_invdiag.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_matrixWrapper.mp_matrix = (this->super_ChIterativeSolverLS).m_spmv;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  super_SparseSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>.
  m_isInitialized = true;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_analysisIsOk = true;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_factorizationIsOk = true;
  (this_00->
  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>).
  m_info = Success;
  CVar1 = Eigen::
          IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>
          ::info(&this_00->
                  super_IterativeSolverBase<Eigen::GMRES<chrono::ChMatrixSPMV,_chrono::ChDiagonalPreconditioner>_>
                );
  return CVar1 == Success;
}

Assistant:

bool ChSolverGMRES::SetupProblem() {
    m_engine->preconditioner().Setup(m_rhs.size(), m_invdiag);
    m_engine->compute(*m_spmv);
    return (m_engine->info() == Eigen::Success);
}